

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

char duckdb::Cast::Operation<duckdb::string_t,signed_char>(string_t input)

{
  string_t sVar1;
  bool bVar2;
  InvalidInputException *this;
  undefined8 in_RSI;
  undefined8 in_RDI;
  anon_union_16_2_67f50693_for_value in_stack_00000040;
  char result;
  string local_48 [55];
  signed local_11 [17];
  
  sVar1.value.pointer.ptr = (char *)in_RSI;
  sVar1.value._0_8_ = in_RDI;
  bVar2 = duckdb::TryCast::Operation<duckdb::string_t,signed_char>(sVar1,local_11,false);
  if (!bVar2) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::string_t,signed_char>((string_t)in_stack_00000040);
    duckdb::InvalidInputException::InvalidInputException(this,local_48);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return (char)local_11[0];
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}